

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_seq_blck(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  csubstr s_00;
  csubstr val;
  ulong uVar9;
  bool bVar10;
  undefined1 uVar11;
  char cVar12;
  int iVar13;
  size_t sVar14;
  State *pSVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  basic_substring<const_char> *pbVar21;
  byte bVar22;
  ro_substr chars;
  csubstr rem;
  csubstr fmt;
  ro_substr pattern;
  ro_substr chars_00;
  bool is_quoted;
  char msg [30];
  csubstr s;
  basic_substring<const_char> local_1c8;
  bool local_1a9;
  basic_substring<const_char> local_1a8;
  undefined6 uStack_198;
  undefined1 uStack_192;
  undefined1 uStack_191;
  undefined6 uStack_190;
  undefined1 uStack_18a;
  undefined4 uStack_189;
  undefined2 local_168;
  csubstr local_158;
  undefined8 local_148;
  char *pcStack_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  char *pcStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  basic_substring<const_char> local_60;
  basic_substring<const_char> local_50;
  Location local_40;
  
  bVar22 = 0;
  pSVar15 = this->m_state;
  local_1c8.str = (pSVar15->line_contents).rem.str;
  local_1c8.len = (pSVar15->line_contents).rem.len;
  if ((pSVar15->flags & 8) == 0) {
    uStack_198 = 0x6c6c615f7361;
    uStack_192 = 0x28;
    uStack_191 = 0x52;
    uStack_190 = 0x2929514553;
    local_1a8.str = (char *)0x6166206b63656863;
    local_1a8.len._0_6_ = 0x203a64656c69;
    local_1a8.len._6_1_ = 0x28;
    local_1a8.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_88 = 0;
    uStack_80 = 0x6e2d;
    local_78 = 0;
    pcStack_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x6e2d) << 0x40);
    LVar2.name.str._0_4_ = 0x200dd7;
    LVar2.super_LineCol.offset = auVar3._0_8_;
    LVar2.super_LineCol.line = auVar3._8_8_;
    LVar2.super_LineCol.col = auVar3._16_8_;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1a8,0x1e,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_state->flags & 0x40) != 0) {
    uStack_198 = 0x6e6f6e5f7361;
    uStack_192 = 0x65;
    uStack_191 = 0x28;
    uStack_190 = 0x292959454b52;
    uStack_18a = 0;
    local_1a8.str = (char *)0x6166206b63656863;
    local_1a8.len._0_6_ = 0x203a64656c69;
    local_1a8.len._6_1_ = 0x28;
    local_1a8.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_b0 = 0;
    uStack_a8 = 0x6e2e;
    local_a0 = 0;
    pcStack_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_90 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x6e2e) << 0x40);
    LVar4.name.str._0_4_ = 0x200dd7;
    LVar4.super_LineCol.offset = auVar3._0_8_;
    LVar4.super_LineCol.line = auVar3._8_8_;
    LVar4.super_LineCol.col = auVar3._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1a8,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_state->flags & 0x10) != 0) {
    uStack_198 = 0x6e6f6e5f7361;
    uStack_192 = 0x65;
    uStack_191 = 0x28;
    uStack_190 = 0x2929574f4c46;
    uStack_18a = 0;
    local_1a8.str = (char *)0x6166206b63656863;
    local_1a8.len._0_6_ = 0x203a64656c69;
    local_1a8.len._6_1_ = 0x28;
    local_1a8.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_d8 = 0;
    uStack_d0 = 0x6e2f;
    local_c8 = 0;
    pcStack_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x6e2f) << 0x40);
    LVar5.name.str._0_4_ = 0x200dd7;
    LVar5.super_LineCol.offset = auVar3._0_8_;
    LVar5.super_LineCol.line = auVar3._8_8_;
    LVar5.super_LineCol.col = auVar3._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1a8,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_1c8.len != 0) && (*local_1c8.str == '#')) {
    _scan_comment(this);
    return true;
  }
  uVar16 = this->m_state->flags;
  cVar12 = (char)uVar16;
  if ((uVar16 >> 8 & 1) == 0) {
    if (-1 < cVar12) {
      return false;
    }
    bVar10 = _handle_indentation(this);
    if (bVar10) {
      return true;
    }
    local_158.str = (char *)0x0;
    local_158.len = 0;
    bVar10 = _scan_scalar_seq_blck(this,&local_158,&local_1a9);
    sVar14 = local_1c8.len;
    if (bVar10) {
      local_1c8.str = (this->m_state->line_contents).rem.str;
      local_1c8.len = (this->m_state->line_contents).rem.len;
      if ((local_1c8.len != 0) && (*local_1c8.str == ' ')) {
        sVar14 = basic_substring<const_char>::first_not_of(&local_1c8,' ',0);
        if (sVar14 == 0xffffffffffffffff) {
          sVar14 = local_1c8.len;
        }
        _line_progressed(this,sVar14);
        if (local_1c8.len < sVar14) {
          if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar1 = (code *)swi(3);
            uVar11 = (*pcVar1)();
            return (bool)uVar11;
          }
          handle_error(0x200e84,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_1a8,local_1c8.str + sVar14,local_1c8.len - sVar14);
        local_1c8.len =
             CONCAT17(local_1a8.len._7_1_,CONCAT16(local_1a8.len._6_1_,(undefined6)local_1a8.len));
        local_1c8.str = local_1a8.str;
      }
      if (local_1c8.len == 0) {
LAB_001d3076:
        if ((local_1c8.len < 2) || (*local_1c8.str != ':')) {
LAB_001d364c:
          val.len = local_158.len;
          val.str = local_158.str;
          _append_val(this,val,(uint)local_1a9);
          this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
          return true;
        }
        lVar17 = 0;
        do {
          lVar18 = lVar17;
          if (lVar18 == 1) break;
          lVar17 = lVar18 + 1;
        } while (local_1c8.str[lVar18 + 1] == "\": "[lVar18 + 2]);
        if (lVar18 == 0) goto LAB_001d364c;
      }
      else {
        if (*local_1c8.str == '#') goto LAB_001d364c;
        if ((local_1c8.len == 0) || (local_1c8.str[local_1c8.len - 1] != ':')) goto LAB_001d3076;
      }
      if (((this->m_key_anchor).len == 0) || ((this->m_key_anchor).str == (char *)0x0)) {
        _move_val_anchor_to_key_anchor(this);
      }
      if (((this->m_key_tag).len == 0) || ((this->m_key_tag).str == (char *)0x0)) {
        _move_val_tag_to_key_tag(this);
      }
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,false);
      _start_map(this,true);
      s_00.len = local_158.len;
      s_00.str = local_158.str;
      _store_scalar(this,s_00,(uint)local_1a9);
      bVar10 = _maybe_set_indentation_from_anchor_or_tag(this);
      if (!bVar10) {
        this->m_state->indref = this->m_state->scalar_col;
      }
      if (((this->m_key_tag2).len != 0) && ((this->m_key_tag2).str != (char *)0x0)) {
        sVar14 = (this->m_key_tag2).len;
        (this->m_key_tag).str = (this->m_key_tag2).str;
        (this->m_key_tag).len = sVar14;
        this->m_key_tag_indentation = this->m_key_tag2_indentation;
        (this->m_key_tag2).str = (char *)0x0;
        (this->m_key_tag2).len = 0;
        this->m_key_tag2_indentation = 0;
      }
      pSVar15 = this->m_state;
      uVar16 = 0xffffff3f;
      goto LAB_001d337b;
    }
    if ((1 < local_1c8.len) && (*local_1c8.str == '-')) {
      lVar17 = 0;
      do {
        lVar18 = lVar17;
        if (lVar18 == 1) break;
        lVar17 = lVar18 + 1;
      } while (local_1c8.str[lVar18 + 1] == "--- "[lVar18 + 3]);
      if (lVar18 != 0) {
        bVar10 = _rval_dash_start_or_continue_seq(this);
        if (!bVar10) {
          return true;
        }
        goto LAB_001d32c2;
      }
    }
    iVar13 = basic_substring<const_char>::compare(&local_1c8,'-');
    if (iVar13 != 0) {
      if (sVar14 == 0) {
LAB_001d3769:
        if ((1 < sVar14) && (*local_1c8.str == '?')) {
          lVar17 = 0;
          do {
            lVar18 = lVar17;
            if (lVar18 == 1) break;
            lVar17 = lVar18 + 1;
          } while (local_1c8.str[lVar18 + 1] == "? "[lVar18 + 1]);
          if (lVar18 != 0) {
            this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
            _push_level(this,false);
            _start_map(this,true);
            this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x60;
            _save_indentation(this,0);
            goto LAB_001d32c2;
          }
        }
        if ((sVar14 != 0) && (*local_1c8.str == ' ')) {
          sVar14 = basic_substring<const_char>::first_not_of(&local_1c8,' ',0);
          if ((sVar14 != 0xffffffffffffffff) && (local_1c8.len < sVar14)) {
            if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar1 = (code *)swi(3);
              uVar11 = (*pcVar1)();
              return (bool)uVar11;
            }
            handle_error(0x200e84,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar14 == 0xffffffffffffffff) {
            local_1a8.str = local_1c8.str;
            local_1a8.len._0_6_ = (undefined6)local_1c8.len;
            local_1a8.len._6_1_ = (undefined1)(local_1c8.len >> 0x30);
            local_1a8.len._7_1_ = (undefined1)(local_1c8.len >> 0x38);
          }
          else {
            basic_substring<const_char>::basic_substring(&local_1a8,local_1c8.str,sVar14);
          }
          sVar14 = CONCAT17(local_1a8.len._7_1_,
                            CONCAT16(local_1a8.len._6_1_,(undefined6)local_1a8.len));
          goto LAB_001d35d5;
        }
        bVar10 = _handle_types(this);
        if (bVar10) {
          return true;
        }
        bVar10 = _handle_val_anchors_and_refs(this);
        if (bVar10) {
          return true;
        }
        if (((uint)this->m_state->flags >> 9 & 1) != 0) {
LAB_001d395f:
          bVar10 = is_debugger_attached();
          if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar1 = (code *)swi(3);
            uVar11 = (*pcVar1)();
            return (bool)uVar11;
          }
LAB_001d36de:
          fmt.len = 0x12;
          fmt.str = "ERROR: parse error";
          _err<>(this,fmt);
          return false;
        }
        if ((local_1c8.len < 2) || (*local_1c8.str != ':')) {
LAB_001d38b6:
          pattern.len = 1;
          pattern.str = "#";
          sVar14 = basic_substring<const_char>::find(&local_1c8,pattern,0);
          if ((sVar14 != 0xffffffffffffffff) && (local_1c8.len < sVar14)) {
            if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar1 = (code *)swi(3);
              uVar11 = (*pcVar1)();
              return (bool)uVar11;
            }
            handle_error(0x200e84,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar14 == 0xffffffffffffffff) {
            local_1a8.str = local_1c8.str;
            local_1a8.len._0_6_ = (undefined6)local_1c8.len;
            local_1a8.len._6_1_ = (undefined1)(local_1c8.len >> 0x30);
            local_1a8.len._7_1_ = (undefined1)(local_1c8.len >> 0x38);
          }
          else {
            basic_substring<const_char>::basic_substring(&local_1a8,local_1c8.str,sVar14);
          }
          local_60.len = CONCAT17(local_1a8.len._7_1_,
                                  CONCAT16(local_1a8.len._6_1_,(undefined6)local_1a8.len));
          local_60.str = local_1a8.str;
          chars_00.len = 1;
          chars_00.str = "\t";
          local_50 = basic_substring<const_char>::trimr(&local_60,chars_00);
          iVar13 = basic_substring<const_char>::compare(&local_50,":",1);
          if (iVar13 != 0) goto LAB_001d395f;
        }
        else {
          lVar17 = 0;
          do {
            lVar18 = lVar17;
            if (lVar18 == 1) break;
            lVar17 = lVar18 + 1;
          } while (local_1c8.str[lVar18 + 1] == "\": "[lVar18 + 2]);
          if (lVar18 == 0) goto LAB_001d38b6;
        }
        if ((((this->m_val_anchor).len == 0) || ((this->m_val_anchor).str == (char *)0x0)) &&
           (((this->m_val_tag).len == 0 || ((this->m_val_tag).str == (char *)0x0)))) {
          pSVar15 = this->m_state;
          pSVar15->flags = pSVar15->flags & 0xfffffe7fU | 0x100;
          sVar14 = pSVar15->indref;
          _push_level(this,false);
          _start_map(this,true);
          _store_scalar_null(this,local_1c8.str);
          pSVar15 = this->m_state;
          pSVar15->flags = pSVar15->flags & 0xffffff3fU | 0x80;
          pSVar15->indref = sVar14 + 2;
          sVar14 = 1;
          if ((local_1c8.len < 2) || (*local_1c8.str != ':')) goto LAB_001d35d5;
          lVar17 = 0;
          do {
            lVar18 = lVar17;
            if (lVar18 == 1) break;
            lVar17 = lVar18 + 1;
          } while (local_1c8.str[lVar18 + 1] == "\": "[lVar18 + 2]);
        }
        else {
          this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
          _move_val_tag_to_key_tag(this);
          _move_val_anchor_to_key_anchor(this);
          _push_level(this,false);
          _start_map(this,true);
          _store_scalar_null(this,local_1c8.str);
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
          bVar10 = _maybe_set_indentation_from_anchor_or_tag(this);
          if (!bVar10) {
            if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar1 = (code *)swi(3);
              uVar11 = (*pcVar1)();
              return (bool)uVar11;
            }
            Location::Location(&local_40,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x6eed,0);
            (*(code *)PTR_error_impl_00243548)
                      ("check failed: _maybe_set_indentation_from_anchor_or_tag()",0x39,
                       (anonymous_namespace)::s_default_callbacks);
          }
          sVar14 = 1;
          if ((local_1c8.len < 2) || (*local_1c8.str != ':')) goto LAB_001d35d5;
          lVar17 = 0;
          do {
            lVar18 = lVar17;
            if (lVar18 == 1) break;
            lVar17 = lVar18 + 1;
          } while (local_1c8.str[lVar18 + 1] == "\": "[lVar18 + 2]);
        }
        sVar14 = 2 - (ulong)(lVar18 == 0);
        goto LAB_001d35d5;
      }
      if (*local_1c8.str == '[') {
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
        _push_level(this,true);
        _start_seq(this,true);
        this->m_state->flags = this->m_state->flags | 0x10;
        goto LAB_001d3385;
      }
      if ((sVar14 == 0) || (*local_1c8.str != '{')) goto LAB_001d3769;
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_map(this,true);
      pSVar15 = this->m_state;
      uVar16 = pSVar15->flags & 0xffffff2fU | 0x50;
      goto LAB_001d3383;
    }
    bVar10 = _rval_dash_start_or_continue_seq(this);
    if (!bVar10) {
      return true;
    }
  }
  else {
    if (cVar12 < '\0') {
      uStack_198 = 0x6e6f6e5f7361;
      uStack_192 = 0x65;
      uStack_191 = 0x28;
      uStack_190 = 0x29294c415652;
      uStack_18a = 0;
      local_1a8.str = (char *)0x6166206b63656863;
      local_1a8.len._0_6_ = 0x203a64656c69;
      local_1a8.len._6_1_ = 0x28;
      local_1a8.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      local_100 = 0;
      uStack_f8 = 0x6e39;
      local_f0 = 0;
      pcStack_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e0 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x6e39) << 0x40);
      LVar6.name.str._0_4_ = 0x200dd7;
      LVar6.super_LineCol.offset = auVar3._0_8_;
      LVar6.super_LineCol.line = auVar3._8_8_;
      LVar6.super_LineCol.col = auVar3._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1a8,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar10 = _handle_indentation(this);
    sVar14 = local_1c8.len;
    if (bVar10) {
      return true;
    }
    if ((1 < local_1c8.len) && (*local_1c8.str == '-')) {
      lVar17 = 0;
      do {
        lVar18 = lVar17;
        if (lVar18 == 1) break;
        lVar17 = lVar18 + 1;
      } while (local_1c8.str[lVar18 + 1] == "--- "[lVar18 + 3]);
      if (lVar18 != 0) {
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x80;
LAB_001d32c2:
        sVar14 = 2;
        goto LAB_001d35d5;
      }
    }
    iVar13 = basic_substring<const_char>::compare(&local_1c8,'-');
    if (iVar13 != 0) {
      if (sVar14 == 0) {
LAB_001d331c:
        if (2 < sVar14) {
          if (*local_1c8.str == '.') {
            uVar9 = 0;
            do {
              uVar20 = uVar9;
              if (uVar20 == 2) break;
              uVar9 = uVar20 + 1;
            } while (local_1c8.str[uVar20 + 1] == "\t..."[uVar20 + 2]);
            if (1 < uVar20) {
              _end_stream(this);
              sVar14 = 3;
              goto LAB_001d35d5;
            }
          }
          if ((2 < sVar14) && (*local_1c8.str == '-')) {
            uVar9 = 0;
            do {
              uVar20 = uVar9;
              if (uVar20 == 2) break;
              uVar9 = uVar20 + 1;
            } while (local_1c8.str[uVar20 + 1] == "---"[uVar20 + 1]);
            if (1 < uVar20) {
              rem.len = sVar14;
              rem.str = local_1c8.str;
              _start_new_doc(this,rem);
              return true;
            }
          }
        }
        bVar10 = is_debugger_attached();
        if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        goto LAB_001d36de;
      }
      if (*local_1c8.str != ' ') {
        lVar17 = 0;
        do {
          lVar18 = lVar17;
          if (lVar18 == 1) break;
          lVar17 = lVar18 + 1;
        } while (*local_1c8.str != " \t"[lVar18 + 1]);
        if (lVar18 != 0) goto LAB_001d331c;
      }
      if ((this->m_state->line_contents).rem.str == (this->m_state->line_contents).full.str) {
        uStack_198 = 0x6c5f74615f20;
        uStack_192 = 0x69;
        uStack_191 = 0x6e;
        uStack_190 = 0x696765625f65;
        uStack_18a = 0x6e;
        local_1a8.str = (char *)0x6166206b63656863;
        local_1a8.len._0_6_ = 0x203a64656c69;
        local_1a8.len._6_1_ = 0x28;
        local_1a8.len._7_1_ = 0x21;
        uStack_189 = 0x292928;
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        local_128 = 0;
        uStack_120 = 0x6e4e;
        local_118 = 0;
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108 = 0x65;
        auVar3 = ZEXT1224(ZEXT412(0x6e4e) << 0x40);
        LVar7.name.str._0_4_ = 0x200dd7;
        LVar7.super_LineCol.offset = auVar3._0_8_;
        LVar7.super_LineCol.line = auVar3._8_8_;
        LVar7.super_LineCol.col = auVar3._16_8_;
        LVar7.name.str._4_4_ = 0;
        LVar7.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1a8,0x23,LVar7,(this->m_stack).m_callbacks.m_user_data);
      }
      if ((this->m_state->line_contents).rem.len == 0) {
LAB_001d34f4:
        pcVar19 = "check failed: (m_state->line_contents.rem.begins_with_any(chars))";
        pbVar21 = &local_1a8;
        for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
          pbVar21->str = *(char **)pcVar19;
          pcVar19 = pcVar19 + ((ulong)bVar22 * -2 + 1) * 8;
          pbVar21 = (basic_substring<const_char> *)&pbVar21[-(ulong)bVar22].len;
        }
        local_168 = 0x29;
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        local_158.str = (char *)0x0;
        local_158.len = 0x6d71;
        local_148 = 0;
        pcStack_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_138 = 0x65;
        auVar3 = ZEXT1224(ZEXT412(0x6d71) << 0x40);
        LVar8.name.str._0_4_ = 0x200dd7;
        LVar8.super_LineCol.offset = auVar3._0_8_;
        LVar8.super_LineCol.line = auVar3._8_8_;
        LVar8.super_LineCol.col = auVar3._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1a8,0x42,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
      else {
        cVar12 = *(this->m_state->line_contents).rem.str;
        if (cVar12 != ' ') {
          lVar17 = 0;
          do {
            lVar18 = lVar17;
            if (lVar18 == 1) break;
            lVar17 = lVar18 + 1;
          } while (cVar12 != " \t"[lVar18 + 1]);
          if (lVar18 != 0) goto LAB_001d34f4;
        }
      }
      chars.len = 2;
      chars.str = " \t";
      sVar14 = basic_substring<const_char>::first_not_of
                         (&(this->m_state->line_contents).rem,chars,0);
      if (sVar14 == 0xffffffffffffffff) {
        sVar14 = (this->m_state->line_contents).rem.len;
      }
      goto LAB_001d35d5;
    }
    pSVar15 = this->m_state;
    uVar16 = 0xfffffe7f;
LAB_001d337b:
    uVar16 = uVar16 & pSVar15->flags | 0x80;
LAB_001d3383:
    pSVar15->flags = uVar16;
  }
LAB_001d3385:
  sVar14 = 1;
LAB_001d35d5:
  _line_progressed(this,sVar14);
  return true;
}

Assistant:

bool Parser::_handle_seq_blck()
{
    _c4dbgpf("handle_seq_impl: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }
    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        if(_handle_indentation())
            return true;

        if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
            _skipchars(" \t");
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("got document start '---'");
            _start_new_doc(rem);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        // there can be empty values
        if(_handle_indentation())
            return true;

        csubstr s;
        bool is_quoted;
        if(_scan_scalar_seq_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;
            if(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(rem.begins_with_any(" \t"), rem.begins_with(' ')))
            {
                _c4dbgp("skipping whitespace...");
                size_t skip = rem.first_not_of(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(" \t", ' '));
                if(skip == csubstr::npos)
                    skip = rem.len; // maybe the line is just whitespace
                _line_progressed(skip);
                rem = rem.sub(skip);
            }

            _c4dbgpf("rem=[{}]~~~{}~~~", rem.len, rem);
            if(!rem.begins_with('#') && (rem.ends_with(':') || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                if(m_key_anchor.empty())
                    _move_val_anchor_to_key_anchor();
                if(m_key_tag.empty())
                    _move_val_tag_to_key_tag();
                addrem_flags(RNXT, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _start_map();
                _store_scalar(s, is_quoted);
                if( ! _maybe_set_indentation_from_anchor_or_tag())
                {
                    _c4dbgpf("set indentation from scalar: {}", m_state->scalar_col);
                    _set_indentation(m_state->scalar_col); // this is the column where the scalar starts
                }
                _move_key_tag2_to_key_tag();
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending val to current seq");
                _append_val(s, is_quoted);
                addrem_flags(RNXT, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgp("val is a child map + this key is complex");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level();
            _start_map();
            addrem_flags(QMRK|RKEY, RVAL);
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        /* pathological case:
         * - &key : val
         * - &key :
         * - : val
         */
        else if((!has_all(SSCL)) &&
                (rem.begins_with(": ") || rem.left_of(rem.find("#")).trimr("\t") == ":"))
        {
            if(!m_val_anchor.empty() || !m_val_tag.empty())
            {
                _c4dbgp("val is a child map + this key is empty, with anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                _move_val_tag_to_key_tag();
                _move_val_anchor_to_key_anchor();
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                RYML_CHECK(_maybe_set_indentation_from_anchor_or_tag()); // one of them must exist
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
            else
            {
                _c4dbgp("val is a child map + this key is empty, no anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                size_t ind = m_state->indref;
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                _c4dbgpf("set indentation from map anchor: {}", ind + 2);
                _set_indentation(ind + 2); // this is the column where the map starts
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
        }
        else
        {
            _c4err("parse error");
        }
    }

    return false;
}